

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::FboCases::BlendTest::render(BlendTest *this,Context *context,Surface *dst)

{
  uint program;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  _func_int **pp_Var4;
  int in_R9D;
  Vec3 local_1d8;
  Vec3 local_1c8;
  Framebuffer fbo;
  SingleTex2DShader shader;
  
  SingleTex2DShader::SingleTex2DShader(&shader);
  program = (*context->_vptr_Context[0x75])(context,&shader);
  uVar2 = this->m_fboWidth;
  uVar3 = this->m_fboHeight;
  createMetaballsTex2D(context,1,0x1908,0x40,0x40,in_R9D);
  Functional::Framebuffer::Framebuffer
            (&fbo,context,&(this->super_FboRenderCase).m_config,uVar2,uVar3,0,0,0,0);
  Functional::Framebuffer::checkCompleteness(&fbo);
  (*context->_vptr_Context[0x76])(context,(ulong)program);
  uVar1 = (*context->_vptr_Context[0x66])(context,(ulong)program,"u_sampler0");
  (*context->_vptr_Context[0x5b])(context,(ulong)uVar1,0);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)fbo.m_framebuffer);
  (*context->_vptr_Context[5])(context,0,0,(ulong)uVar2,(ulong)uVar3);
  (*context->_vptr_Context[6])(context,0xde1,1);
  (*context->_vptr_Context[0x2a])(0x3f19999a,0,0x3f19999a,0x3f800000,context);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  (*context->_vptr_Context[0x33])(context,0xbe2);
  (*context->_vptr_Context[0x3f])(context,0x8006);
  (*context->_vptr_Context[0x42])(context,0x302,0x303,0,1);
  local_1c8.m_data[0] = -1.0;
  local_1c8.m_data[1] = -1.0;
  local_1c8.m_data[2] = 0.0;
  local_1d8.m_data[0] = 1.0;
  local_1d8.m_data[1] = 1.0;
  local_1d8.m_data[2] = 0.0;
  sglr::drawQuad(context,program,&local_1c8,&local_1d8);
  (*context->_vptr_Context[0x34])(context,0xbe2);
  pp_Var4 = context->_vptr_Context;
  if (fbo.m_config.colorbufferType == 0xde1) {
    (*pp_Var4[9])(context,0x8d40,0);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)fbo.m_colorbuffer);
    uVar2 = (*context->_vptr_Context[2])(context);
    uVar3 = (*context->_vptr_Context[3])(context);
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar2,(ulong)uVar3);
    local_1c8.m_data[0] = -1.0;
    local_1c8.m_data[1] = -1.0;
    local_1c8.m_data[2] = 0.0;
    local_1d8.m_data[0] = 1.0;
    local_1d8.m_data[1] = 1.0;
    local_1d8.m_data[2] = 0.0;
    sglr::drawQuad(context,program,&local_1c8,&local_1d8);
    uVar2 = (*context->_vptr_Context[2])(context);
    uVar3 = (*context->_vptr_Context[3])(context);
    pp_Var4 = context->_vptr_Context;
  }
  (*pp_Var4[0x80])(context,dst,0,0,(ulong)uVar2,(ulong)uVar3);
  Functional::Framebuffer::~Framebuffer(&fbo);
  sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
  return;
}

Assistant:

void BlendTest::render (sglr::Context& context, Surface& dst)
{
	SingleTex2DShader	shader;
	deUint32			shaderID		= context.createProgram(&shader);
	int					width			= m_fboWidth;
	int					height			= m_fboHeight;
	deUint32			metaballsTex	= 1;

	createMetaballsTex2D(context, metaballsTex, GL_RGBA, GL_UNSIGNED_BYTE, 64, 64);

	Framebuffer fbo(context, getConfig(), width, height);
	fbo.checkCompleteness();

	shader.setUnit(context, shaderID, 0);

	context.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	context.viewport(0, 0, width, height);
	context.bindTexture(GL_TEXTURE_2D, metaballsTex);
	context.clearColor(0.6f, 0.0f, 0.6f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	context.enable(GL_BLEND);
	context.blendEquation(GL_FUNC_ADD);
	context.blendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ZERO, GL_ONE);
	sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
	context.disable(GL_BLEND);

	if (fbo.getConfig().colorbufferType == GL_TEXTURE_2D)
	{
		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.bindTexture(GL_TEXTURE_2D, fbo.getColorbuffer());
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
		context.readPixels(dst, 0, 0, width, height);
}